

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageWriterJPG.cpp
# Opt level: O0

boolean irr::video::jpeg_empty_output_buffer(j_compress_ptr cinfo)

{
  long *plVar1;
  long lVar2;
  long *in_RDI;
  mem_dest_ptr dest;
  
  plVar1 = (long *)in_RDI[5];
  lVar2 = (*(code *)**(undefined8 **)plVar1[5])((undefined8 *)plVar1[5],plVar1 + 6,0x1000);
  if (lVar2 != 0x1000) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x26;
    (**(code **)*in_RDI)(in_RDI);
  }
  *plVar1 = (long)(plVar1 + 6);
  plVar1[1] = 0x1000;
  return 1;
}

Assistant:

static boolean jpeg_empty_output_buffer(j_compress_ptr cinfo)
{
	mem_dest_ptr dest = (mem_dest_ptr)cinfo->dest;

	// for now just exit upon file error
	if (dest->file->write(dest->buffer, OUTPUT_BUF_SIZE) != OUTPUT_BUF_SIZE)
		ERREXIT(cinfo, JERR_FILE_WRITE);

	dest->pub.next_output_byte = dest->buffer;
	dest->pub.free_in_buffer = OUTPUT_BUF_SIZE;

	return TRUE;
}